

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
          (Iterator<TestType,_false,_std::allocator<unsigned_long>_> *this)

{
  View<TestType,_false,_std::allocator<unsigned_long>_> *pVVar1;
  ulong uVar2;
  reference pTVar3;
  unsigned_long uVar4;
  reference pTVar5;
  runtime_error *prVar6;
  size_t sVar7;
  pointer puVar8;
  size_t sVar9;
  long lVar10;
  size_type __n;
  long lVar11;
  size_t sVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> testCoord;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  pVVar1 = this->view_;
  if (pVVar1 == (View<TestType,_false,_std::allocator<unsigned_long>_> *)0x0) {
    if ((((this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start) && (this->index_ == 0)) &&
       (this->pointer_ == (pointer)0x0)) {
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
  }
  else {
    uVar2 = (pVVar1->geometry_).size_;
    if (uVar2 == 0) {
      if ((((this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) && (this->index_ == 0)) &&
         (this->pointer_ == (pointer)0x0)) {
        return;
      }
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Assertion failed.");
    }
    else {
      sVar12 = this->index_;
      if (uVar2 < sVar12) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
      }
      else {
        pTVar3 = this->pointer_;
        if (sVar12 == uVar2) {
          pTVar5 = View<TestType,_false,_std::allocator<unsigned_long>_>::operator()
                             (pVVar1,uVar2 - 1);
          if (pTVar3 != pTVar5 + 1) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
            goto LAB_0022e76e;
          }
        }
        else {
          pTVar5 = View<TestType,_false,_std::allocator<unsigned_long>_>::operator()(pVVar1,sVar12);
          if (pTVar3 != pTVar5) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
            goto LAB_0022e76e;
          }
        }
        pVVar1 = this->view_;
        View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if ((pVVar1->geometry_).isSimple_ != false) {
          return;
        }
        pVVar1 = this->view_;
        if (pVVar1->data_ == (pointer)0x0) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"Assertion failed.");
        }
        else {
          __n = (long)(this->coordinates_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->coordinates_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
          if (__n == (pVVar1->geometry_).dimension_) {
            if (this->index_ != (pVVar1->geometry_).size_) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_38,__n,&local_39);
              View<TestType,false,std::allocator<unsigned_long>>::
              indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<TestType,false,std::allocator<unsigned_long>> *)this->view_,
                         this->index_,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_38.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start);
              puVar8 = (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar10 = (long)(this->coordinates_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
              if (lVar10 != 0) {
                lVar10 = lVar10 >> 3;
                lVar11 = 0;
                do {
                  if (puVar8[lVar11] !=
                      local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar11]) {
                    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
                    __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
              }
              if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
                operator_delete(local_38.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_38.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_38.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              return;
            }
            View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
            if ((pVVar1->geometry_).coordinateOrder_ == LastMajorOrder) {
              sVar12 = *(this->coordinates_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              sVar7 = View<TestType,_false,_std::allocator<unsigned_long>_>::shape(this->view_,0);
              if (sVar12 == sVar7) {
                puVar8 = (this->coordinates_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(this->coordinates_).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar8) < 9) {
                  return;
                }
                sVar12 = 1;
                while (uVar4 = puVar8[sVar12],
                      sVar7 = View<TestType,_false,_std::allocator<unsigned_long>_>::shape
                                        (this->view_,sVar12), uVar4 == sVar7 - 1) {
                  sVar12 = sVar12 + 1;
                  puVar8 = (this->coordinates_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->coordinates_).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3)
                      <= sVar12) {
                    return;
                  }
                }
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              }
              else {
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              }
            }
            else {
              pVVar1 = this->view_;
              if (pVVar1->data_ == (pointer)0x0) {
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              }
              else {
                sVar12 = (pVVar1->geometry_).dimension_;
                sVar7 = (this->coordinates_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar12 - 1];
                sVar12 = sVar12 - 1;
                sVar9 = View<TestType,_false,_std::allocator<unsigned_long>_>::shape(pVVar1,sVar12);
                if (sVar7 == sVar9) {
                  if (sVar12 == 0) {
                    return;
                  }
                  sVar7 = 0;
                  while (uVar4 = (this->coordinates_).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[sVar7],
                        sVar9 = View<TestType,_false,_std::allocator<unsigned_long>_>::shape
                                          (this->view_,sVar7), uVar4 == sVar9 - 1) {
                    sVar7 = sVar7 + 1;
                    if (sVar12 == sVar7) {
                      return;
                    }
                  }
                  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar6,"Assertion failed.");
                }
                else {
                  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar6,"Assertion failed.");
                }
              }
            }
          }
          else {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
          }
        }
      }
    }
  }
LAB_0022e76e:
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void 
Iterator<T, isConst, A>::testInvariant() const
{
    if(!MARRAY_NO_DEBUG) {
        if(view_ == 0) { 
            marray_detail::Assert(coordinates_.size() == 0 
                && index_ == 0
                && pointer_ == 0);
        }
        else { 
            if(view_->size() == 0) { // un-initialized view
                marray_detail::Assert(coordinates_.size() == 0 
                    && index_ == 0
                    && pointer_ == 0);
            }
            else { // initialized view
                marray_detail::Assert(index_ >= 0 && index_ <= view_->size());
                if(index_ == view_->size()) { // end iterator
                    marray_detail::Assert(pointer_ == &((*view_)(view_->size()-1)) + 1);
                }
                else {
                    marray_detail::Assert(pointer_ == &((*view_)(index_)));
                }
                if(!view_->isSimple()) {
                    marray_detail::Assert(coordinates_.size() == view_->dimension());
                    if(index_ == view_->size()) { // end iterator
                        if(view_->coordinateOrder() == LastMajorOrder) {
                            marray_detail::Assert(coordinates_[0] == view_->shape(0));
                            for(std::size_t j=1; j<coordinates_.size(); ++j) {
                                marray_detail::Assert(coordinates_[j] == view_->shape(j)-1);
                            }
                        }
                        else { // FirstMajorOrder
                            std::size_t d = view_->dimension() - 1;
                            marray_detail::Assert(coordinates_[d] == view_->shape(d));
                            for(std::size_t j=0; j<d; ++j) {
                                marray_detail::Assert(coordinates_[j] == view_->shape(j)-1);
                            }
                        }
                    }
                    else {
                        std::vector<std::size_t> testCoord(coordinates_.size());
                        view_->indexToCoordinates(index_, testCoord.begin());
                        for(std::size_t j=0; j<coordinates_.size(); ++j) {
                            marray_detail::Assert(coordinates_[j] == testCoord[j]);
                        }
                    }
                }
            }
        }
    }
}